

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_stmt_status(sqlite3_stmt *pStmt,int op,int resetFlag)

{
  long lVar1;
  sqlite3 *db;
  Vdbe *pVStack_20;
  u32 v;
  Vdbe *pVdbe;
  int resetFlag_local;
  int op_local;
  sqlite3_stmt *pStmt_local;
  
  if (op == 99) {
    lVar1 = *(long *)pStmt;
    pVStack_20 = (Vdbe *)pStmt;
    pVdbe._0_4_ = resetFlag;
    pVdbe._4_4_ = op;
    _resetFlag_local = pStmt;
    sqlite3_mutex_enter(*(sqlite3_mutex **)(lVar1 + 0x18));
    db._4_4_ = 0;
    *(long *)(lVar1 + 0x300) = (long)&db + 4;
    *(undefined8 *)(lVar1 + 0x1e8) = *(undefined8 *)(lVar1 + 0x1e0);
    sqlite3VdbeDelete(pVStack_20);
    *(undefined8 *)(lVar1 + 0x300) = 0;
    *(undefined8 *)(lVar1 + 0x1e8) = *(undefined8 *)(lVar1 + 0x1f0);
    sqlite3_mutex_leave(*(sqlite3_mutex **)(lVar1 + 0x18));
  }
  else {
    db._4_4_ = *(int *)(pStmt + (long)op * 4 + 0xd4);
    if (resetFlag != 0) {
      *(undefined4 *)(pStmt + (long)op * 4 + 0xd4) = 0;
    }
  }
  return db._4_4_;
}

Assistant:

SQLITE_API int sqlite3_stmt_status(sqlite3_stmt *pStmt, int op, int resetFlag){
  Vdbe *pVdbe = (Vdbe*)pStmt;
  u32 v;
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !pStmt
   || (op!=SQLITE_STMTSTATUS_MEMUSED && (op<0||op>=ArraySize(pVdbe->aCounter)))
  ){
    (void)SQLITE_MISUSE_BKPT;
    return 0;
  }
#endif
  if( op==SQLITE_STMTSTATUS_MEMUSED ){
    sqlite3 *db = pVdbe->db;
    sqlite3_mutex_enter(db->mutex);
    v = 0;
    db->pnBytesFreed = (int*)&v;
    assert( db->lookaside.pEnd==db->lookaside.pTrueEnd );
    db->lookaside.pEnd = db->lookaside.pStart;
    sqlite3VdbeDelete(pVdbe);
    db->pnBytesFreed = 0;
    db->lookaside.pEnd = db->lookaside.pTrueEnd;
    sqlite3_mutex_leave(db->mutex);
  }else{
    v = pVdbe->aCounter[op];
    if( resetFlag ) pVdbe->aCounter[op] = 0;
  }
  return (int)v;
}